

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::adoptDecimalFormatSymbols
          (RuleBasedNumberFormat *this,DecimalFormatSymbols *symbolsToAdopt)

{
  NFRule *pNVar1;
  UErrorCode *status_00;
  int local_20;
  UErrorCode local_1c;
  int32_t i;
  UErrorCode status;
  DecimalFormatSymbols *symbolsToAdopt_local;
  RuleBasedNumberFormat *this_local;
  
  if (symbolsToAdopt != (DecimalFormatSymbols *)0x0) {
    _i = symbolsToAdopt;
    symbolsToAdopt_local = (DecimalFormatSymbols *)this;
    if ((this->decimalFormatSymbols != (DecimalFormatSymbols *)0x0) &&
       (this->decimalFormatSymbols != (DecimalFormatSymbols *)0x0)) {
      (*(this->decimalFormatSymbols->super_UObject)._vptr_UObject[1])();
    }
    this->decimalFormatSymbols = _i;
    local_1c = U_ZERO_ERROR;
    pNVar1 = this->defaultInfinityRule;
    if (pNVar1 != (NFRule *)0x0) {
      NFRule::~NFRule(pNVar1);
      UMemory::operator_delete((UMemory *)pNVar1,symbolsToAdopt);
    }
    this->defaultInfinityRule = (NFRule *)0x0;
    status_00 = &local_1c;
    initializeDefaultInfinityRule(this,status_00);
    pNVar1 = this->defaultNaNRule;
    if (pNVar1 != (NFRule *)0x0) {
      NFRule::~NFRule(pNVar1);
      UMemory::operator_delete((UMemory *)pNVar1,status_00);
    }
    this->defaultNaNRule = (NFRule *)0x0;
    initializeDefaultNaNRule(this,&local_1c);
    if (this->fRuleSets != (NFRuleSet **)0x0) {
      for (local_20 = 0; local_20 < this->numRuleSets; local_20 = local_20 + 1) {
        NFRuleSet::setDecimalFormatSymbols(this->fRuleSets[local_20],_i,&local_1c);
      }
    }
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::adoptDecimalFormatSymbols(DecimalFormatSymbols* symbolsToAdopt)
{
    if (symbolsToAdopt == NULL) {
        return; // do not allow caller to set decimalFormatSymbols to NULL
    }

    if (decimalFormatSymbols != NULL) {
        delete decimalFormatSymbols;
    }

    decimalFormatSymbols = symbolsToAdopt;

    {
        // Apply the new decimalFormatSymbols by reparsing the rulesets
        UErrorCode status = U_ZERO_ERROR;

        delete defaultInfinityRule;
        defaultInfinityRule = NULL;
        initializeDefaultInfinityRule(status); // Reset with the new DecimalFormatSymbols

        delete defaultNaNRule;
        defaultNaNRule = NULL;
        initializeDefaultNaNRule(status); // Reset with the new DecimalFormatSymbols

        if (fRuleSets) {
            for (int32_t i = 0; i < numRuleSets; i++) {
                fRuleSets[i]->setDecimalFormatSymbols(*symbolsToAdopt, status);
            }
        }
    }
}